

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O3

DdNode ** Extra_bddSpaceExorGates(DdManager *dd,DdNode *bFuncRed,DdNode *zEquations)

{
  int *support;
  DdNode **ppDVar1;
  DdNode *n;
  uint uVar2;
  DdNode *pDVar3;
  uint uVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  bool bVar8;
  
  iVar5 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar5 = dd->sizeZ;
  }
  support = (int *)malloc((long)iVar5 << 2);
  Extra_SupportArray(dd,bFuncRed,support);
  ppDVar1 = (DdNode **)calloc(1,(long)dd->size << 3);
  Cudd_Ref(zEquations);
  pDVar7 = zEquations;
  if (dd->zero != zEquations) {
    do {
      n = Extra_zddSelectOneSubset(dd,pDVar7);
      Cudd_Ref(n);
      zEquations = Cudd_zddDiff(dd,pDVar7,n);
      Cudd_Ref(zEquations);
      Cudd_RecursiveDerefZdd(dd,pDVar7);
      pDVar7 = dd->one;
      if (n == pDVar7) {
LAB_0080cc64:
        __assert_fail("iVarNonCan != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddAuto.c"
                      ,0x215,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)");
      }
      uVar2 = 0xffffffff;
      pDVar3 = n;
      do {
        uVar4 = pDVar3->index >> 1;
        if ((support[uVar4] == 1) && (bVar8 = uVar2 != 0xffffffff, uVar2 = uVar4, bVar8)) {
          __assert_fail("iVarNonCan == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddAuto.c"
                        ,0x211,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)");
        }
        pDVar3 = (pDVar3->type).kids.T;
      } while (pDVar3 != pDVar7);
      if (uVar2 == 0xffffffff) goto LAB_0080cc64;
      pDVar3 = dd->zero;
      if (pDVar3 == n || n == pDVar7) {
LAB_0080cc03:
        Cudd_RecursiveDerefZdd(dd,n);
        pDVar3 = dd->zero;
      }
      else {
        iVar5 = 1;
        pDVar6 = n;
        do {
          pDVar6 = (pDVar6->type).kids.T;
          iVar5 = iVar5 + -1;
        } while (pDVar6 != pDVar7);
        if (iVar5 == 0) goto LAB_0080cc03;
        ppDVar1[uVar2] = n;
      }
      pDVar7 = zEquations;
    } while (zEquations != pDVar3);
  }
  Cudd_RecursiveDerefZdd(dd,zEquations);
  if (support != (int *)0x0) {
    free(support);
  }
  return ppDVar1;
}

Assistant:

DdNode ** Extra_bddSpaceExorGates( DdManager * dd, DdNode * bFuncRed, DdNode * zEquations )
{
    DdNode ** pzRes;
    int * pVarsNonCan;
    DdNode * zEquRem;
    int iVarNonCan;
    DdNode * zExor, * zTemp;

    // get the set of non-canonical variables
    pVarsNonCan = ABC_ALLOC( int, ddMax(dd->size,dd->sizeZ) );
    Extra_SupportArray( dd, bFuncRed, pVarsNonCan );

    // allocate storage for the EXOR sets
    pzRes = ABC_ALLOC( DdNode *, dd->size );
    memset( pzRes, 0, sizeof(DdNode *) * dd->size );

    // go through all the equations
    zEquRem = zEquations;  Cudd_Ref( zEquRem );
    while ( zEquRem != z0 )
    {
        // extract one product
        zExor = Extra_zddSelectOneSubset( dd, zEquRem );   Cudd_Ref( zExor );
        // remove it from the set
        zEquRem = Cudd_zddDiff( dd, zTemp = zEquRem, zExor );  Cudd_Ref( zEquRem );
        Cudd_RecursiveDerefZdd( dd, zTemp );

        // locate the non-canonical variable
        iVarNonCan = -1;
        for ( zTemp = zExor; zTemp != z1; zTemp = cuddT(zTemp) )
        {
            if ( pVarsNonCan[zTemp->index/2] == 1 )
            {
                assert( iVarNonCan == -1 );
                iVarNonCan = zTemp->index/2;
            }
        }
        assert( iVarNonCan != -1 );

        if ( Extra_zddLitCountComb( dd, zExor ) > 1 )
            pzRes[ iVarNonCan ] = zExor; // takes ref
        else
            Cudd_RecursiveDerefZdd( dd, zExor );
    }
    Cudd_RecursiveDerefZdd( dd, zEquRem );

    ABC_FREE( pVarsNonCan );
    return pzRes;
}